

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMemoryStressTests.cpp
# Opt level: O1

IterateResult __thiscall deqp::egl::MemoryStressCase::iterate(MemoryStressCase *this)

{
  bool bVar1;
  ObjectType OVar2;
  int iVar3;
  int iVar4;
  TestLog *pTVar5;
  EGLDisplay pvVar6;
  EGLConfig pvVar7;
  iterator __position;
  int *piVar8;
  undefined1 auVar9 [8];
  TestLog *pTVar10;
  deUint32 dVar11;
  int iVar12;
  MemoryAllocator *pMVar13;
  deUint64 dVar14;
  deUint64 dVar15;
  ulong uVar16;
  char *description;
  qpTestResult testResult;
  TestContext *pTVar17;
  undefined1 auVar18 [8];
  uint uVar19;
  int iVar20;
  float fVar21;
  vector<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
  types;
  value_type local_1bc;
  undefined1 local_1b8 [8];
  TestLog *pTStack_1b0;
  pointer local_1a8;
  ios_base local_140 [272];
  
  pTVar17 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  pTVar5 = pTVar17->m_log;
  local_1b8 = (undefined1  [8])pTVar5;
  if (this->m_iteration < this->m_iterationCount) {
    if (this->m_allocator == (MemoryAllocator *)0x0) {
      pMVar13 = (MemoryAllocator *)operator_new(0x1ac0);
      pvVar6 = this->m_display;
      pvVar7 = this->m_config;
      dVar11 = this->m_seed;
      OVar2 = (this->m_spec).types;
      iVar12 = (this->m_spec).minWidth;
      iVar20 = (this->m_spec).minHeight;
      iVar3 = (this->m_spec).maxWidth;
      iVar4 = (this->m_spec).maxHeight;
      bVar1 = (this->m_spec).use;
      pMVar13->m_eglTestCtx = (this->super_TestCase).m_eglTestCtx;
      pMVar13->m_display = pvVar6;
      pMVar13->m_config = pvVar7;
      glw::Functions::Functions(&pMVar13->m_gl);
      deRandom_init(&(pMVar13->m_rnd).m_rnd,dVar11);
      pMVar13->m_failed = false;
      (pMVar13->m_errorString)._M_dataplus._M_p = (pointer)&(pMVar13->m_errorString).field_2;
      (pMVar13->m_errorString)._M_string_length = 0;
      (pMVar13->m_errorString).field_2._M_local_buf[0] = '\0';
      pMVar13->m_types = OVar2;
      pMVar13->m_minWidth = iVar12;
      pMVar13->m_minHeight = iVar20;
      pMVar13->m_maxWidth = iVar3;
      pMVar13->m_maxHeight = iVar4;
      pMVar13->m_use = bVar1;
      (pMVar13->m_pbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pMVar13->m_pbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pMVar13->m_pbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pMVar13->m_contexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pMVar13->m_contexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pMVar13->m_contexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      EglTestContext::initGLFunctions(pMVar13->m_eglTestCtx,&pMVar13->m_gl,(ApiType)0x2);
      this->m_allocator = pMVar13;
    }
    pMVar13 = this->m_allocator;
    dVar14 = deGetMicroseconds();
    local_1b8 = (undefined1  [8])0x0;
    pTStack_1b0 = (TestLog *)0x0;
    local_1a8 = (pointer)0x0;
    if ((pMVar13->m_types & OBJECTTYPE_CONTEXT) != 0) {
      local_1bc = OBJECTTYPE_CONTEXT;
      std::
      vector<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
      ::push_back((vector<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
                   *)local_1b8,&local_1bc);
    }
    if ((pMVar13->m_types & OBJECTTYPE_PBUFFER) != 0) {
      local_1bc = OBJECTTYPE_PBUFFER;
      std::
      vector<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
      ::push_back((vector<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
                   *)local_1b8,&local_1bc);
    }
    if ((((pMVar13->m_contexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          (pMVar13->m_contexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_start) &&
        ((pMVar13->m_pbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
         super__Vector_impl_data._M_finish ==
         (pMVar13->m_pbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
         super__Vector_impl_data._M_start)) && (pMVar13->m_use == true)) {
      egl::anon_unknown_0::MemoryAllocator::allocateContext(pMVar13);
      egl::anon_unknown_0::MemoryAllocator::allocatePBuffer(pMVar13);
    }
    pTVar10 = pTStack_1b0;
    auVar9 = local_1b8;
    do {
      bVar1 = pMVar13->m_failed;
      if (bVar1 != false) break;
      iVar12 = 0;
      if (auVar9 != (undefined1  [8])pTVar10) {
        uVar19 = 1;
        auVar18 = auVar9;
        do {
          if (((int)(uVar19 - 1) < 1) ||
             (dVar11 = deRandom_getUint32(&(pMVar13->m_rnd).m_rnd), (int)(dVar11 % uVar19) < 1)) {
            iVar12 = *(int *)&((TestLog *)auVar18)->m_log;
          }
          auVar18 = (undefined1  [8])((long)&((TestLog *)auVar18)->m_log + 4);
          uVar19 = uVar19 + 1;
        } while (auVar18 != (undefined1  [8])pTVar10);
      }
      if (iVar12 == 1) {
        egl::anon_unknown_0::MemoryAllocator::allocatePBuffer(pMVar13);
      }
      else if (iVar12 == 2) {
        egl::anon_unknown_0::MemoryAllocator::allocateContext(pMVar13);
      }
      dVar15 = deGetMicroseconds();
    } while (dVar15 - dVar14 < 0x989681);
    if (auVar9 != (undefined1  [8])0x0) {
      operator_delete((void *)auVar9,(long)local_1a8 - (long)auVar9);
    }
    if (bVar1 != false) {
      local_1b8 = (undefined1  [8])pTVar5;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pTStack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pTStack_1b0,"Iteration ",10);
      std::ostream::operator<<((ostringstream *)&pTStack_1b0,this->m_iteration);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pTStack_1b0,": Allocated ",0xc)
      ;
      pMVar13 = this->m_allocator;
      std::ostream::operator<<
                ((ostringstream *)&pTStack_1b0,
                 (int)((ulong)((long)(pMVar13->m_contexts).
                                     super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(pMVar13->m_contexts).
                                    super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 3) +
                 (int)((ulong)((long)(pMVar13->m_pbuffers).
                                     super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(pMVar13->m_pbuffers).
                                    super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 3));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pTStack_1b0," objects; ",10);
      std::ostream::operator<<
                ((ostringstream *)&pTStack_1b0,
                 (int)((ulong)((long)(this->m_allocator->m_contexts).
                                     super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(this->m_allocator->m_contexts).
                                    super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 3));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pTStack_1b0," contexts, ",0xb);
      std::ostream::operator<<
                ((ostringstream *)&pTStack_1b0,
                 (int)((ulong)((long)(this->m_allocator->m_pbuffers).
                                     super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(this->m_allocator->m_pbuffers).
                                    super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 3));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pTStack_1b0," PBuffers.",10);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pTStack_1b0);
      std::ios_base::~ios_base(local_140);
      local_1b8 = (undefined1  [8])pTVar5;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pTStack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pTStack_1b0,"Got expected error: ",0x14);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pTStack_1b0,(this->m_allocator->m_errorString)._M_dataplus._M_p,
                 (this->m_allocator->m_errorString)._M_string_length);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pTStack_1b0);
      std::ios_base::~ios_base(local_140);
      pMVar13 = this->m_allocator;
      iVar12 = (int)((ulong)((long)(pMVar13->m_contexts).
                                   super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(pMVar13->m_contexts).
                                  super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 3) +
               (int)((ulong)((long)(pMVar13->m_pbuffers).
                                   super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(pMVar13->m_pbuffers).
                                  super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 3);
      local_1b8._0_4_ = iVar12;
      __position._M_current =
           (this->m_allocationCounts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_allocationCounts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&this->m_allocationCounts,__position,(int *)local_1b8);
      }
      else {
        *__position._M_current = iVar12;
        (this->m_allocationCounts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      pMVar13 = this->m_allocator;
      if (pMVar13 != (MemoryAllocator *)0x0) {
        egl::anon_unknown_0::MemoryAllocator::~MemoryAllocator(pMVar13);
        operator_delete(pMVar13,0x1ac0);
      }
      this->m_allocator = (MemoryAllocator *)0x0;
      this->m_iteration = this->m_iteration + 1;
      return CONTINUE;
    }
    local_1b8 = (undefined1  [8])pTVar5;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pTStack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pTStack_1b0,"Couldn\'t exhaust memory before timeout. Allocated ",0x32);
    pMVar13 = this->m_allocator;
    std::ostream::operator<<
              ((ostringstream *)&pTStack_1b0,
               (int)((ulong)((long)(pMVar13->m_contexts).
                                   super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(pMVar13->m_contexts).
                                  super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 3) +
               (int)((ulong)((long)(pMVar13->m_pbuffers).
                                   super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(pMVar13->m_pbuffers).
                                  super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 3));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pTStack_1b0," objects.",9);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pTStack_1b0);
    std::ios_base::~ios_base(local_140);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    pMVar13 = this->m_allocator;
    if (pMVar13 != (MemoryAllocator *)0x0) {
      egl::anon_unknown_0::MemoryAllocator::~MemoryAllocator(pMVar13);
      operator_delete(pMVar13,0x1ac0);
    }
    this->m_allocator = (MemoryAllocator *)0x0;
  }
  else {
    piVar8 = (this->m_allocationCounts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar12 = *piVar8;
    uVar19 = (uint)((ulong)((long)(this->m_allocationCounts).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)piVar8) >> 2);
    iVar20 = iVar12;
    if (0 < (int)uVar19) {
      uVar16 = 0;
      do {
        iVar3 = piVar8[uVar16];
        if (iVar3 < iVar12) {
          iVar12 = iVar3;
        }
        if (iVar20 < iVar3) {
          iVar20 = iVar3;
        }
        uVar16 = uVar16 + 1;
      } while ((uVar19 & 0x7fffffff) != uVar16);
    }
    if (iVar12 == 0 && iVar20 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pTStack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pTStack_1b0,"Allocation count zero",0x15);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pTStack_1b0);
      std::ios_base::~ios_base(local_140);
      pTVar17 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
    else {
      fVar21 = (float)(iVar12 - iVar20) / (float)iVar20;
      if (fVar21 <= 50.0) {
        tcu::TestContext::setTestResult(pTVar17,QP_TEST_RESULT_PASS,"Pass");
        return STOP;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pTStack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pTStack_1b0,"Allocated objects max: ",0x17);
      std::ostream::operator<<((ostringstream *)&pTStack_1b0,iVar20);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pTStack_1b0,", min: ",7);
      std::ostream::operator<<((ostringstream *)&pTStack_1b0,iVar12);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pTStack_1b0,", difference: ",0xe);
      std::ostream::_M_insert<double>((double)fVar21);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pTStack_1b0,"% threshold: ",0xd);
      std::ostream::_M_insert<double>(50.0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pTStack_1b0,"%",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pTStack_1b0);
      std::ios_base::~ios_base(local_140);
      pTVar17 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      description = "Allocation count variation";
      testResult = QP_TEST_RESULT_QUALITY_WARNING;
    }
    tcu::TestContext::setTestResult(pTVar17,testResult,description);
  }
  return STOP;
}

Assistant:

TestCase::IterateResult MemoryStressCase::iterate (void)
{
	TestLog& log = m_testCtx.getLog();

	if (m_iteration < m_iterationCount)
	{
		try
		{
			if (!m_allocator)
				m_allocator = new MemoryAllocator(m_eglTestCtx, m_display, m_config, m_seed, m_spec.types, m_spec.minWidth, m_spec.minHeight, m_spec.maxWidth, m_spec.maxHeight, m_spec.use);

			if (m_allocator->allocateUntilFailure())
			{
				log << TestLog::Message << "Couldn't exhaust memory before timeout. Allocated " << m_allocator->getAllocationCount() << " objects." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

				delete m_allocator;
				m_allocator = NULL;

				return STOP;
			}

			log << TestLog::Message << "Iteration " << m_iteration << ": Allocated " << m_allocator->getAllocationCount() << " objects; " << m_allocator->getContextCount() << " contexts, " << m_allocator->getPBufferCount() << " PBuffers." << TestLog::EndMessage;
			log << TestLog::Message << "Got expected error: " << m_allocator->getErrorString() << TestLog::EndMessage;
			m_allocationCounts.push_back(m_allocator->getAllocationCount());

			delete m_allocator;
			m_allocator = NULL;

			m_iteration++;

			return CONTINUE;
		} catch (...)
		{
			log << TestLog::Message << "Iteration " << m_iteration << ": Allocated " << m_allocator->getAllocationCount() << " objects; " << m_allocator->getContextCount() << " contexts, " << m_allocator->getPBufferCount() << " PBuffers." << TestLog::EndMessage;
			log << TestLog::Message << "Unexpected error" << TestLog::EndMessage;
			throw;
		}
	}
	else
	{
		// Analyze number of passed allocations.
		int min = m_allocationCounts[0];
		int max = m_allocationCounts[0];

		float threshold = 50.0f;

		for (int allocNdx = 0; allocNdx < (int)m_allocationCounts.size(); allocNdx++)
		{
			min = deMin32(m_allocationCounts[allocNdx], min);
			max = deMax32(m_allocationCounts[allocNdx], max);
		}

		if (min == 0 && max != 0)
		{
			log << TestLog::Message << "Allocation count zero" << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
		else
		{
			float change = (float)(min - max) / ((float)(max));

			if (change > threshold)
			{
				log << TestLog::Message << "Allocated objects max: " << max << ", min: " << min << ", difference: " << change << "% threshold: " << threshold << "%" << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, "Allocation count variation");
			}
			else
				m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		}

		return STOP;
	}
}